

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O2

void cht_Give(player_t *player,char *name,int amount)

{
  APlayerPawn *this;
  AWeapon *pAVar1;
  PClassWeapon *type;
  BYTE *pBVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  PClassInventory *pPVar7;
  AActor *pAVar8;
  AHexenArmor *this_00;
  ABasicArmorPickup *this_01;
  AInventory *pAVar9;
  PClassWeapon *pPVar10;
  PClassActor *pPVar11;
  PClassInventory *pPVar12;
  uint i;
  ulong uVar13;
  uint i_3;
  bool bVar14;
  
  if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
    pcVar6 = userinfo_t::GetName(&player->userinfo);
    Printf("%s is a cheater: give %s\n",pcVar6,name);
  }
  this = player->mo;
  if (this == (APlayerPawn *)0x0) {
    return;
  }
  if (player->health < 1) {
    return;
  }
  iVar5 = strcasecmp(name,"all");
  if (iVar5 == 0) {
    bVar3 = false;
    bVar14 = false;
  }
  else {
    iVar5 = strcasecmp(name,"everything");
    bVar14 = iVar5 == 0;
    bVar3 = !bVar14;
  }
  iVar5 = strcasecmp(name,"health");
  if (iVar5 == 0) {
    if (amount < 1) {
      iVar5 = APlayerPawn::GetMaxHealth(this);
      (player->mo->super_AActor).health = iVar5;
    }
    else {
      iVar5 = (this->super_AActor).health + amount;
      (this->super_AActor).health = iVar5;
    }
    player->health = iVar5;
  }
  if ((bVar3) && (iVar5 = strcasecmp(name,"backpack"), iVar5 != 0)) {
    iVar5 = strcasecmp(name,"ammo");
    if (iVar5 == 0) goto LAB_003b64d7;
    iVar5 = strcasecmp(name,"armor");
    if (iVar5 == 0) goto LAB_003b6569;
    iVar5 = strcasecmp(name,"keys");
    if (iVar5 == 0) goto LAB_003b6622;
    iVar5 = strcasecmp(name,"weapons");
    if (iVar5 == 0) goto LAB_003b669c;
    iVar5 = strcasecmp(name,"artifacts");
    if (iVar5 != 0) {
      iVar5 = strcasecmp(name,"puzzlepieces");
      if (iVar5 != 0) {
        pPVar7 = (PClassInventory *)PClass::FindActor(name);
        if ((pPVar7 != (PClassInventory *)0x0) &&
           (bVar3 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,(PClass *)pPVar7),
           bVar3)) {
          AActor::GiveInventory(&player->mo->super_AActor,pPVar7,amount,true);
          return;
        }
        if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
          return;
        }
        Printf("Unknown item \"%s\"\n",name);
        return;
      }
      goto LAB_003b6870;
    }
  }
  else {
    pPVar7 = (PClassInventory *)PClass::FindActor(&gameinfo.backpacktype);
    if (pPVar7 != (PClassInventory *)0x0) {
      AActor::GiveInventory(&player->mo->super_AActor,pPVar7,1,true);
    }
    if (bVar3) {
      return;
    }
LAB_003b64d7:
    for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
      pPVar11 = PClassActor::AllActorClasses.Array[uVar13];
      if ((pPVar11->super_PClass).ParentClass == AAmmo::RegistrationInfo.MyClass) {
        pAVar9 = AActor::FindInventory(&player->mo->super_AActor,pPVar11,false);
        if (pAVar9 == (AInventory *)0x0) {
          pAVar8 = Spawn(pPVar11);
          (*(pAVar8->super_DThinker).super_DObject._vptr_DObject[0x29])(pAVar8,player->mo);
          *(undefined4 *)&pAVar8[1].super_DThinker.super_DObject.Class =
               *(undefined4 *)((long)&pAVar8[1].super_DThinker.super_DObject.Class + 4);
        }
        else if (pAVar9->Amount < pAVar9->MaxAmount) {
          pAVar9->Amount = pAVar9->MaxAmount;
        }
      }
    }
    if (bVar3) {
      return;
    }
LAB_003b6569:
    if (gameinfo.gametype == GAME_Hexen) {
      for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
        this_00 = Spawn<AHexenArmor>();
        (this_00->super_AArmor).super_AInventory.super_AActor.health = iVar5;
        (this_00->super_AArmor).super_AInventory.Amount = 0;
        bVar4 = AInventory::CallTryPickup
                          ((AInventory *)this_00,&player->mo->super_AActor,(AActor **)0x0);
        if (!bVar4) {
          (*(this_00->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.
            _vptr_DObject[4])(this_00);
        }
      }
    }
    else {
      this_01 = Spawn<ABasicArmorPickup>();
      this_01->SaveAmount = deh.BlueAC * 100;
      this_01->SavePercent =
           (double)(~-(ulong)(0.0 < gameinfo.Armor2Percent) & 0x3fe0000000000000 |
                   (ulong)gameinfo.Armor2Percent & -(ulong)(0.0 < gameinfo.Armor2Percent));
      bVar4 = AInventory::CallTryPickup
                        ((AInventory *)this_01,&player->mo->super_AActor,(AActor **)0x0);
      if (!bVar4) {
        (*(this_01->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.
          _vptr_DObject[4])(this_01);
      }
    }
    if (bVar3) {
      return;
    }
LAB_003b6622:
    for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
      bVar4 = PClass::IsAncestorOf
                        (AKey::RegistrationInfo.MyClass,
                         &PClassActor::AllActorClasses.Array[uVar13]->super_PClass);
      if ((bVar4) &&
         ((PClassActor::AllActorClasses.Array[uVar13]->super_PClass).Defaults[0x4fc] != '\0')) {
        pAVar9 = (AInventory *)Spawn(PClassActor::AllActorClasses.Array[uVar13]);
        bVar4 = AInventory::CallTryPickup(pAVar9,&player->mo->super_AActor,(AActor **)0x0);
        if (!bVar4) {
          (*(pAVar9->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar9);
        }
      }
    }
    if (bVar3) {
      return;
    }
LAB_003b669c:
    pAVar1 = player->PendingWeapon;
    for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
      type = (PClassWeapon *)PClassActor::AllActorClasses.Array[uVar13];
      if ((type != (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) &&
         (bVar4 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,(PClass *)type), bVar4)) {
        pPVar10 = (PClassWeapon *)PClassActor::GetReplacement((PClassActor *)type,true);
        if (pPVar10 != type) {
          pPVar11 = PClassActor::GetReplacement((PClassActor *)type,true);
          bVar4 = PClass::IsAncestorOf
                            (ADehackedPickup::RegistrationInfo.MyClass,&pPVar11->super_PClass);
          if (!bVar4) goto LAB_003b675f;
        }
        bVar4 = FWeaponSlots::LocateWeapon(&player->weapons,type,(int *)0x0,(int *)0x0);
        if ((bVar4) &&
           ((bVar14 ||
            (((type->super_PClassInventory).super_PClassActor.super_PClass.Defaults[0x4ff] & 8) == 0
            )))) {
          AActor::GiveInventory(&player->mo->super_AActor,(PClassInventory *)type,1,true);
        }
      }
LAB_003b675f:
    }
    player->PendingWeapon = pAVar1;
    if (bVar3) {
      return;
    }
  }
  for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
    pPVar7 = (PClassInventory *)PClassActor::AllActorClasses.Array[uVar13];
    bVar4 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,(PClass *)pPVar7);
    if (((((bVar4) &&
          (pBVar2 = (pPVar7->super_PClassActor).super_PClass.Defaults, 0 < *(int *)(pBVar2 + 0x4d8))
          ) && (1 < *(int *)(pBVar2 + 0x4cc))) &&
        ((bVar4 = PClass::IsAncestorOf(APuzzleItem::RegistrationInfo.MyClass,(PClass *)pPVar7),
         !bVar4 && (bVar4 = PClass::IsAncestorOf
                                      (APowerup::RegistrationInfo.MyClass,(PClass *)pPVar7), !bVar4)
         ))) && ((bVar4 = PClass::IsAncestorOf(AArmor::RegistrationInfo.MyClass,(PClass *)pPVar7),
                 !bVar4 && ((bVar14 ||
                            (pPVar12 = (PClassInventory *)
                                       PClassActor::GetReplacement((PClassActor *)pPVar7,true),
                            pPVar12 == pPVar7)))))) {
      iVar5 = amount;
      if (amount < 1) {
        iVar5 = *(int *)(pBVar2 + 0x4cc);
      }
      AActor::GiveInventory(&player->mo->super_AActor,pPVar7,iVar5,true);
    }
  }
  if (bVar3) {
    return;
  }
LAB_003b6870:
  for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
    pPVar7 = (PClassInventory *)PClassActor::AllActorClasses.Array[uVar13];
    bVar3 = PClass::IsAncestorOf(APuzzleItem::RegistrationInfo.MyClass,(PClass *)pPVar7);
    if (((bVar3) &&
        (pBVar2 = (pPVar7->super_PClassActor).super_PClass.Defaults, 0 < *(int *)(pBVar2 + 0x4d8)))
       && ((bVar14 ||
           (pPVar12 = (PClassInventory *)PClassActor::GetReplacement((PClassActor *)pPVar7,true),
           pPVar12 == pPVar7)))) {
      iVar5 = amount;
      if (amount < 1) {
        iVar5 = *(int *)(pBVar2 + 0x4cc);
      }
      AActor::GiveInventory(&player->mo->super_AActor,pPVar7,iVar5,true);
    }
  }
  return;
}

Assistant:

void cht_Give (player_t *player, const char *name, int amount)
{
	enum { ALL_NO, ALL_YES, ALL_YESYES } giveall;
	int i;
	PClassActor *type;

	if (player != &players[consoleplayer])
		Printf ("%s is a cheater: give %s\n", player->userinfo.GetName(), name);

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	giveall = ALL_NO;
	if (stricmp (name, "all") == 0)
	{
		giveall = ALL_YES;
	}
	else if (stricmp (name, "everything") == 0)
	{
		giveall = ALL_YESYES;
	}

	if (stricmp (name, "health") == 0)
	{
		if (amount > 0)
		{
			player->mo->health += amount;
			player->health = player->mo->health;
		}
		else
		{
			player->health = player->mo->health = player->mo->GetMaxHealth();
		}
	}

	if (giveall || stricmp (name, "backpack") == 0)
	{
		// Select the correct type of backpack based on the game
		type = PClass::FindActor(gameinfo.backpacktype);
		if (type != NULL)
		{
			player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "ammo") == 0)
	{
		// Find every unique type of ammo. Give it to the player if
		// he doesn't have it already, and set each to its maximum.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClassActor *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS(AAmmo))
			{
				PClassAmmo *atype = static_cast<PClassAmmo *>(type);
				AInventory *ammo = player->mo->FindInventory(atype);
				if (ammo == NULL)
				{
					ammo = static_cast<AInventory *>(Spawn (atype));
					ammo->AttachToOwner (player->mo);
					ammo->Amount = ammo->MaxAmount;
				}
				else if (ammo->Amount < ammo->MaxAmount)
				{
					ammo->Amount = ammo->MaxAmount;
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "armor") == 0)
	{
		if (gameinfo.gametype != GAME_Hexen)
		{
			ABasicArmorPickup *armor = Spawn<ABasicArmorPickup> ();
			armor->SaveAmount = 100*deh.BlueAC;
			armor->SavePercent = gameinfo.Armor2Percent > 0? gameinfo.Armor2Percent : 0.5;
			if (!armor->CallTryPickup (player->mo))
			{
				armor->Destroy ();
			}
		}
		else
		{
			for (i = 0; i < 4; ++i)
			{
				AHexenArmor *armor = Spawn<AHexenArmor> ();
				armor->health = i;
				armor->Amount = 0;
				if (!armor->CallTryPickup (player->mo))
				{
					armor->Destroy ();
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			if (PClassActor::AllActorClasses[i]->IsDescendantOf (RUNTIME_CLASS(AKey)))
			{
				AKey *key = (AKey *)GetDefaultByType (PClassActor::AllActorClasses[i]);
				if (key->KeyNumber != 0)
				{
					key = static_cast<AKey *>(Spawn(static_cast<PClassActor *>(PClassActor::AllActorClasses[i])));
					if (!key->CallTryPickup (player->mo))
					{
						key->Destroy ();
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "weapons") == 0)
	{
		AWeapon *savedpending = player->PendingWeapon;
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			// Don't give replaced weapons unless the replacement was done by Dehacked.
			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS(AWeapon)) &&
				(static_cast<PClassActor *>(type)->GetReplacement() == type ||
				 static_cast<PClassActor *>(type)->GetReplacement()->IsDescendantOf(RUNTIME_CLASS(ADehackedPickup))))
			{
				// Give the weapon only if it belongs to the current game or
				if (player->weapons.LocateWeapon(static_cast<PClassWeapon*>(type), NULL, NULL))
				{
					AWeapon *def = (AWeapon*)GetDefaultByType (type);
					if (giveall == ALL_YESYES || !(def->WeaponFlags & WIF_CHEATNOTWEAPON))
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
					}
				}
			}
		}
		player->PendingWeapon = savedpending;

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid() && def->MaxAmount > 1 &&
					!type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(AArmor)))
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid())
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall)
		return;

	type = PClass::FindActor(name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount, true);
	}
	return;
}